

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraphd.cpp
# Opt level: O2

int64_t __thiscall TPZGraphElTd::EqNum(TPZGraphElTd *this,TPZVec<int> *co)

{
  uint uVar1;
  int iVar2;
  int64_t iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar2 = ((this->super_TPZGraphEl).fGraphMesh)->fResolution;
  iVar3 = TPZGraphNode::FirstPoint(this->fConnect);
  uVar1 = *co->fStore;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  iVar4 = (int)uVar5;
  return (long)(((iVar4 << ((byte)iVar2 & 0x1f)) + iVar4 + co->fStore[1] + (int)iVar3) -
               (int)((iVar4 - 1) * uVar5 >> 1));
}

Assistant:

int64_t TPZGraphElTd::EqNum(TPZVec<int> &co){
	int res = fGraphMesh->Res();
	int imax = (1<<res)+1;
	int neq = fConnect->FirstPoint() + co[1];
	for(int run=0;run<co[0];run++) neq += imax-run;
	return neq;
}